

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * httplib::detail::encode_url(string *__return_storage_ptr__,string *s)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char hex [4];
  char local_34 [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar4 = 0;
  do {
    bVar1 = (s->_M_dataplus)._M_p[lVar4];
    uVar3 = (uint)bVar1;
    if (bVar1 < 0x27) {
      if (bVar1 < 0xd) {
        if (uVar3 != 10) {
          if (uVar3 == 0) {
            return __return_storage_ptr__;
          }
          goto LAB_00112148;
        }
      }
      else if ((bVar1 != 0xd) && (bVar1 != 0x20)) goto LAB_00112148;
LAB_00112137:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (0x2b < bVar1) {
        if ((uVar3 != 0x2c) && (uVar3 != 0x3b)) goto LAB_00112148;
        goto LAB_00112137;
      }
      if ((uVar3 == 0x27) || (uVar3 == 0x2b)) goto LAB_00112137;
LAB_00112148:
      if ((char)bVar1 < '\0') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        iVar2 = snprintf(local_34,3,"%02X",(ulong)uVar3);
        if (iVar2 != 2) {
          __assert_fail("len == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h"
                        ,0x62f,"std::string httplib::detail::encode_url(const std::string &)");
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_34);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

inline std::string encode_url(const std::string &s) {
			std::string result;

			for (size_t i = 0; s[i]; i++) {
				switch (s[i]) {
					case ' ': result += "%20"; break;
					case '+': result += "%2B"; break;
					case '\r': result += "%0D"; break;
					case '\n': result += "%0A"; break;
					case '\'': result += "%27"; break;
					case ',': result += "%2C"; break;
						// case ':': result += "%3A"; break; // ok? probably...
					case ';': result += "%3B"; break;
					default:
						auto c = static_cast<uint8_t>(s[i]);
						if (c >= 0x80) {
							result += '%';
							char hex[4];
							auto len = snprintf(hex, sizeof(hex) - 1, "%02X", c);
							assert(len == 2);
							result.append(hex, static_cast<size_t>(len));
						} else {
							result += s[i];
						}
						break;
				}
			}

			return result;
		}